

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-platform-output.c
# Opt level: O0

int run_test_platform_output(void)

{
  int iVar1;
  int local_6f8;
  int err;
  int i;
  int count;
  uv_utsname_t uname;
  uv_passwd_t pwd;
  uv_interface_address_t *interfaces;
  uv_cpu_info_t *cpus;
  uv_rusage_t rusage;
  uv_pid_t ppid;
  uv_pid_t pid;
  double uptime;
  size_t size;
  size_t rss;
  char buffer [512];
  
  iVar1 = uv_get_process_title((char *)&rss,0x200);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x2c,"err == 0");
    abort();
  }
  printf("uv_get_process_title: %s\n",&rss);
  uptime = 2.52961610670718e-321;
  iVar1 = uv_cwd((char *)&rss,(size_t *)&uptime);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x31,"err == 0");
    abort();
  }
  printf("uv_cwd: %s\n",&rss);
  iVar1 = uv_resident_set_memory(&size);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x38,"err == 0");
    abort();
  }
  printf("uv_resident_set_memory: %llu\n",size);
  iVar1 = uv_uptime((double *)&ppid);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x40,"err == 0");
    abort();
  }
  if (_ppid <= 0.0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x41,"uptime > 0");
    abort();
  }
  printf("uv_uptime: %f\n",_ppid);
  iVar1 = uv_getrusage((uv_rusage_t *)&cpus);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x46,"err == 0");
    abort();
  }
  if ((long)cpus < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x47,"rusage.ru_utime.tv_sec >= 0");
    abort();
  }
  if (-1 < rusage.ru_utime.tv_sec) {
    if (rusage.ru_utime.tv_usec < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
              ,0x49,"rusage.ru_stime.tv_sec >= 0");
      abort();
    }
    if (rusage.ru_stime.tv_sec < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
              ,0x4a,"rusage.ru_stime.tv_usec >= 0");
      abort();
    }
    printf("uv_getrusage:\n");
    printf("  user: %llu sec %llu microsec\n",cpus,rusage.ru_utime.tv_sec);
    printf("  system: %llu sec %llu microsec\n",rusage.ru_utime.tv_usec,rusage.ru_stime.tv_sec);
    printf("  page faults: %llu\n",rusage.ru_minflt);
    printf("  maximum resident set size: %llu\n",rusage.ru_stime.tv_usec);
    iVar1 = uv_cpu_info((uv_cpu_info_t **)&interfaces,&err);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
              ,0x5a,"err == 0");
      abort();
    }
    printf("uv_cpu_info:\n");
    for (local_6f8 = 0; local_6f8 < err; local_6f8 = local_6f8 + 1) {
      printf("  model: %s\n",*(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + -8));
      printf("  speed: %d\n",(ulong)*(uint *)(interfaces->phys_addr + (long)local_6f8 * 0x38));
      printf("  times.sys: %llu\n",
             *(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + 0x18));
      printf("  times.user: %llu\n",
             *(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + 8));
      printf("  times.idle: %llu\n",
             *(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + 0x20));
      printf("  times.irq: %llu\n",
             *(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + 0x28));
      printf("  times.nice: %llu\n",
             *(undefined8 *)(interfaces->phys_addr + (long)local_6f8 * 0x38 + 0x10));
    }
    uv_free_cpu_info((uv_cpu_info_t *)interfaces,err);
    iVar1 = uv_interface_addresses((uv_interface_address_t **)&pwd.homedir,&err);
    if (iVar1 == 0) {
      printf("uv_interface_addresses:\n");
      for (local_6f8 = 0; local_6f8 < err; local_6f8 = local_6f8 + 1) {
        printf("  name: %s\n",*(undefined8 *)(pwd.homedir + (long)local_6f8 * 0x50));
        printf("  internal: %d\n",(ulong)*(uint *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x10));
        printf("  physical address: ");
        printf("%02x:%02x:%02x:%02x:%02x:%02x\n",
               (ulong)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 8],
               (ulong)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 9],
               (ulong)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 10],
               (ulong)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 0xb],
               (ulong)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 0xc],
               (uint)(byte)pwd.homedir[(long)local_6f8 * 0x50 + 0xd]);
        if (*(short *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x14) == 2) {
          uv_ip4_name((sockaddr_in *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x14),(char *)&rss,
                      0x200);
        }
        else if (*(short *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x14) == 10) {
          uv_ip6_name((sockaddr_in6 *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x14),(char *)&rss,
                      0x200);
        }
        printf("  address: %s\n",&rss);
        if (*(short *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x30) == 2) {
          uv_ip4_name((sockaddr_in *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x30),(char *)&rss,
                      0x200);
          printf("  netmask: %s\n",&rss);
        }
        else if (*(short *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x30) == 10) {
          uv_ip6_name((sockaddr_in6 *)(pwd.homedir + (long)local_6f8 * 0x50 + 0x30),(char *)&rss,
                      0x200);
          printf("  netmask: %s\n",&rss);
        }
        else {
          printf("  netmask: none\n");
        }
      }
      uv_free_interface_addresses((uv_interface_address_t *)pwd.homedir,err);
      iVar1 = uv_os_get_passwd((uv_passwd_t *)(uname.machine + 0xf8));
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
                ,0x91,"err == 0");
        abort();
      }
      printf("uv_os_get_passwd:\n");
      printf("  euid: %ld\n",pwd.username);
      printf("  gid: %ld\n",pwd.uid);
      printf("  username: %s\n",uname.machine._248_8_);
      printf("  shell: %s\n",pwd.gid);
      printf("  home directory: %s\n",pwd.shell);
      rusage.ru_nivcsw._4_4_ = uv_os_getpid();
      if ((int)rusage.ru_nivcsw._4_4_ < 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
                ,0x9b,"pid > 0");
        abort();
      }
      printf("uv_os_getpid: %d\n",(ulong)rusage.ru_nivcsw._4_4_);
      rusage.ru_nivcsw._0_4_ = uv_os_getppid();
      if (0 < (int)(uint)rusage.ru_nivcsw) {
        printf("uv_os_getppid: %d\n",(ulong)(uint)rusage.ru_nivcsw);
        iVar1 = uv_os_uname((uv_utsname_t *)&i);
        if (iVar1 == 0) {
          printf("uv_os_uname:\n");
          printf("  sysname: %s\n",&i);
          printf("  release: %s\n",uname.sysname + 0xf8);
          printf("  version: %s\n",uname.release + 0xf8);
          printf("  machine: %s\n",uname.version + 0xf8);
          return 0;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
                ,0xa2,"err == 0");
        abort();
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
              ,0x9e,"ppid > 0");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
            ,0x6d,"err == 0");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-platform-output.c"
          ,0x48,"rusage.ru_utime.tv_usec >= 0");
  abort();
}

Assistant:

TEST_IMPL(platform_output) {
  char buffer[512];
  size_t rss;
  size_t size;
  double uptime;
  uv_pid_t pid;
  uv_pid_t ppid;
  uv_rusage_t rusage;
  uv_cpu_info_t* cpus;
  uv_interface_address_t* interfaces;
  uv_passwd_t pwd;
  uv_utsname_t uname;
  int count;
  int i;
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);
  printf("uv_get_process_title: %s\n", buffer);

  size = sizeof(buffer);
  err = uv_cwd(buffer, &size);
  ASSERT(err == 0);
  printf("uv_cwd: %s\n", buffer);

  err = uv_resident_set_memory(&rss);
#if defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  printf("uv_resident_set_memory: %llu\n", (unsigned long long) rss);
#endif

  err = uv_uptime(&uptime);
#if defined(__PASE__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);
  ASSERT(uptime > 0);
  printf("uv_uptime: %f\n", uptime);
#endif

  err = uv_getrusage(&rusage);
  ASSERT(err == 0);
  ASSERT(rusage.ru_utime.tv_sec >= 0);
  ASSERT(rusage.ru_utime.tv_usec >= 0);
  ASSERT(rusage.ru_stime.tv_sec >= 0);
  ASSERT(rusage.ru_stime.tv_usec >= 0);
  printf("uv_getrusage:\n");
  printf("  user: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_utime.tv_sec,
         (unsigned long long) rusage.ru_utime.tv_usec);
  printf("  system: %llu sec %llu microsec\n",
         (unsigned long long) rusage.ru_stime.tv_sec,
         (unsigned long long) rusage.ru_stime.tv_usec);
  printf("  page faults: %llu\n", (unsigned long long) rusage.ru_majflt);
  printf("  maximum resident set size: %llu\n",
         (unsigned long long) rusage.ru_maxrss);

  err = uv_cpu_info(&cpus, &count);
#if defined(__CYGWIN__) || defined(__MSYS__)
  ASSERT(err == UV_ENOSYS);
#else
  ASSERT(err == 0);

  printf("uv_cpu_info:\n");
  for (i = 0; i < count; i++) {
    printf("  model: %s\n", cpus[i].model);
    printf("  speed: %d\n", cpus[i].speed);
    printf("  times.sys: %llu\n", (unsigned long long) cpus[i].cpu_times.sys);
    printf("  times.user: %llu\n",
           (unsigned long long) cpus[i].cpu_times.user);
    printf("  times.idle: %llu\n",
           (unsigned long long) cpus[i].cpu_times.idle);
    printf("  times.irq: %llu\n",  (unsigned long long) cpus[i].cpu_times.irq);
    printf("  times.nice: %llu\n",
           (unsigned long long) cpus[i].cpu_times.nice);
  }
#endif
  uv_free_cpu_info(cpus, count);

  err = uv_interface_addresses(&interfaces, &count);
  ASSERT(err == 0);

  printf("uv_interface_addresses:\n");
  for (i = 0; i < count; i++) {
    printf("  name: %s\n", interfaces[i].name);
    printf("  internal: %d\n", interfaces[i].is_internal);
    printf("  physical address: ");
    printf("%02x:%02x:%02x:%02x:%02x:%02x\n",
           (unsigned char)interfaces[i].phys_addr[0],
           (unsigned char)interfaces[i].phys_addr[1],
           (unsigned char)interfaces[i].phys_addr[2],
           (unsigned char)interfaces[i].phys_addr[3],
           (unsigned char)interfaces[i].phys_addr[4],
           (unsigned char)interfaces[i].phys_addr[5]);

    if (interfaces[i].address.address4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].address.address4, buffer, sizeof(buffer));
    } else if (interfaces[i].address.address4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].address.address6, buffer, sizeof(buffer));
    }

    printf("  address: %s\n", buffer);

    if (interfaces[i].netmask.netmask4.sin_family == AF_INET) {
      uv_ip4_name(&interfaces[i].netmask.netmask4, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else if (interfaces[i].netmask.netmask4.sin_family == AF_INET6) {
      uv_ip6_name(&interfaces[i].netmask.netmask6, buffer, sizeof(buffer));
      printf("  netmask: %s\n", buffer);
    } else {
      printf("  netmask: none\n");
    }
  }
  uv_free_interface_addresses(interfaces, count);

  err = uv_os_get_passwd(&pwd);
  ASSERT(err == 0);

  printf("uv_os_get_passwd:\n");
  printf("  euid: %ld\n", pwd.uid);
  printf("  gid: %ld\n", pwd.gid);
  printf("  username: %s\n", pwd.username);
  printf("  shell: %s\n", pwd.shell);
  printf("  home directory: %s\n", pwd.homedir);

  pid = uv_os_getpid();
  ASSERT(pid > 0);
  printf("uv_os_getpid: %d\n", (int) pid);
  ppid = uv_os_getppid();
  ASSERT(ppid > 0);
  printf("uv_os_getppid: %d\n", (int) ppid);

  err = uv_os_uname(&uname);
  ASSERT(err == 0);
  printf("uv_os_uname:\n");
  printf("  sysname: %s\n", uname.sysname);
  printf("  release: %s\n", uname.release);
  printf("  version: %s\n", uname.version);
  printf("  machine: %s\n", uname.machine);

  return 0;
}